

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAgi.c
# Opt level: O3

int Agi_ManSuppSizeTest(Agi_Man_t *p)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int level;
  long lVar4;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  iVar1 = p->nObjs;
  uVar3 = 0;
  if (1 < iVar1) {
    uVar3 = 0;
    lVar4 = 1;
    do {
      if (p->pObjs[lVar4] < 0xfffffffbfffffffa) {
        p->nTravIds = p->nTravIds + 1;
        iVar1 = Agi_ManSuppSize_rec(p,(int)lVar4);
        uVar3 = uVar3 + (iVar1 < 0x11);
        iVar1 = p->nObjs;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar1);
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar3,(ulong)(uint)p->nNodes);
  level = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar2) / 1000000.0);
  return uVar3;
}

Assistant:

int Agi_ManSuppSizeTest( Agi_Man_t * p )
{
    abctime clk = Abc_Clock();
    int i, Counter = 0;
    Agi_ManForEachNode( p, i )
        Counter += (Agi_ManSuppSizeOne(p, i) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Agi_ManNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;

}